

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O3

int __thiscall BPlusTree::GetHeight(BPlusTree *this)

{
  element_type *peVar1;
  long *plVar2;
  undefined8 *puVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar5;
  long *plVar6;
  
  peVar1 = (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    iVar5 = 0;
  }
  else {
    plVar2 = *(long **)&(peVar1->ptrs).
                        super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                        ._M_impl.super__Vector_impl_data;
    plVar6 = (long *)*plVar2;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (plVar6 == (long *)0x0) {
      iVar5 = 0;
    }
    else {
      this_01 = this_00;
      iVar4 = 1;
      do {
        iVar5 = iVar4;
        this_00 = this_01;
        if ((char)plVar6[6] != '\0') break;
        puVar3 = (undefined8 *)*plVar6;
        plVar6 = (long *)*puVar3;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        this_01 = this_00;
        iVar4 = iVar5 + 1;
      } while (plVar6 != (long *)0x0);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return iVar5;
}

Assistant:

int BPlusTree::GetHeight() {
    int height = 0;
    if (root == nullptr) {
        return 0;
    } else {
        std::shared_ptr<Node> traverseNode = std::static_pointer_cast<Node>(root->ptrs[0]);
        while (traverseNode != nullptr) {
            height++;
            if (traverseNode->isLeaf) {
                break;
            } else {
                traverseNode = std::static_pointer_cast<Node>(traverseNode->ptrs[0]);
            }
        }
    }
    return height;
}